

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall ot::commissioner::Interpreter::PrintOrExport(Interpreter *this,Value *aValue)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer aPath;
  format_args args;
  string_view fmt;
  Error error;
  string out;
  string filePath;
  string output;
  undefined1 local_e8 [8];
  _Alloc_hider _Stack_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  code *local_c0;
  type local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Value::ToString_abi_cxx11_(&local_50,aValue);
  if ((aValue->mError).mCode == kNone) {
    aPath = (this->mContext).mExportFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 != aPath) {
      local_b8 = none_type;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      while( true ) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (aPath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + aPath->_M_string_length);
        RestoreFilePath((Error *)local_e8,aPath);
        local_b8 = local_e8._0_4_;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&_Stack_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_e0._M_p != &local_d0) {
          operator_delete(_Stack_e0._M_p);
        }
        if (local_b8 != none_type) {
          Console::Write(&local_b0,kRed);
          goto LAB_0024b05c;
        }
        Value::ToString_abi_cxx11_(&local_90,aValue);
        WriteFile((Error *)local_e8,&local_90,&local_70);
        local_b8 = local_e8._0_4_;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&_Stack_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_e0._M_p != &local_d0) {
          operator_delete(_Stack_e0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_b8 != none_type) break;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        aPath = aPath + 1;
        if (aPath == pbVar1) goto LAB_0024b073;
      }
      local_e8._0_4_ = string_type;
      _Stack_e0._M_p = "failed to write to \'{}\'\n";
      local_d8 = 0x18;
      local_d0._M_allocated_capacity = 0x100000000;
      local_c0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      begin = "failed to write to \'{}\'\n";
      local_d0._8_8_ = local_e8;
      do {
        pcVar3 = begin + 1;
        if (*begin == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_e8);
        }
        begin = pcVar3;
      } while (pcVar3 != "");
      local_e8 = (undefined1  [8])local_70._M_dataplus._M_p;
      _Stack_e0._M_p = (pointer)local_70._M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_e8;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x18;
      ::fmt::v10::vformat_abi_cxx11_(&local_90,(v10 *)"failed to write to \'{}\'\n",fmt,args);
      Console::Write(&local_90,kRed);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
LAB_0024b05c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
LAB_0024b073:
      if (local_b8 == none_type) {
        local_50._M_string_length = 0;
        *local_50._M_dataplus._M_p = '\0';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
  }
  if (local_50._M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_50);
  }
  std::__cxx11::string::append((char *)&local_50);
  Console::Write(&local_50,((aValue->mError).mCode == kNone) + kRed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Interpreter::PrintOrExport(const Value &aValue)
{
    std::string output = aValue.ToString();

    if (aValue.HasNoError() && mContext.mExportFiles.size() > 0)
    {
        Error error;

        for (const auto &path : mContext.mExportFiles)
        {
            std::string filePath = path;

            // Make sure folder path exists, if it's not creatable, print error and output to console instead
            error = RestoreFilePath(path);
            if (error != ERROR_NONE)
            {
                Console::Write(error.GetMessage(), Console::Color::kRed);
                break;
            }
            ///
            /// @todo: maybe instead of overwriting an existing file
            ///        suggest a new file name by incrementing suffix
            ///        filePath[-suffix].ext
            ///
            error = WriteFile(aValue.ToString(), filePath);
            if (error != ERROR_NONE)
            {
                std::string out = fmt::format(FMT_STRING("failed to write to '{}'\n"), filePath);
                Console::Write(out, Console::Color::kRed);
                break;
            }
        }
        if (error == ERROR_NONE)
        {
            // value is written to file, no console output expected other than
            // [done]/[failed]
            output.clear();
        }
    }
    if (!output.empty())
    {
        output += "\n";
    }
    output += aValue.HasNoError() ? "[done]" : "[failed]";
    auto color = aValue.HasNoError() ? Console::Color::kGreen : Console::Color::kRed;

    Console::Write(output, color);
}